

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

BOOL CONTEXT_GetRegisters(DWORD processId,LPCONTEXT lpContext)

{
  uint uVar1;
  FILE *__stream;
  DWORD DVar2;
  long lVar3;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  undefined1 local_490 [8];
  pt_regs ptrace_registers;
  ucontext_t registers;
  BOOL bRet;
  LPCONTEXT lpContext_local;
  DWORD processId_local;
  
  DVar2 = GetCurrentProcessId();
  if (processId == DVar2) {
    CONTEXT_CaptureContext(lpContext);
  }
  else {
    lVar3 = ptrace(PTRACE_GETREGS,(ulong)processId,local_490,0);
    if (lVar3 == -1) {
      fprintf(_stderr,"] %s %s:%d","CONTEXT_GetRegisters",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
              ,0x166);
      __stream = _stderr;
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(__stream,"Failed ptrace(PT_GETREGS, processId:%d) errno:%d (%s)\n",(ulong)processId,
              (ulong)uVar1,pcVar6);
    }
    CONTEXTFromNativeContext
              ((native_context_t *)&ptrace_registers.ss,lpContext,lpContext->ContextFlags);
  }
  return 1;
}

Assistant:

BOOL CONTEXT_GetRegisters(DWORD processId, LPCONTEXT lpContext)
{
#if HAVE_BSD_REGS_T
    int regFd = -1;
#endif  // HAVE_BSD_REGS_T
    BOOL bRet = FALSE;

    if (processId == GetCurrentProcessId())
    {
        CONTEXT_CaptureContext(lpContext);
    }
    else
    {
        ucontext_t registers;
#if HAVE_PT_REGS
        struct pt_regs ptrace_registers;
        if (ptrace((__ptrace_request)PTRACE_GETREGS, processId, (caddr_t) &ptrace_registers, 0) == -1)
#elif HAVE_BSD_REGS_T
        struct reg ptrace_registers;
        if (PAL_PTRACE(PT_GETREGS, processId, &ptrace_registers, 0) == -1)
#endif
        {
            ASSERT("Failed ptrace(PT_GETREGS, processId:%d) errno:%d (%s)\n",
                   processId, errno, strerror(errno));
        }

#if HAVE_PT_REGS
#define ASSIGN_REG(reg) MCREG_##reg(registers.uc_mcontext) = PTREG_##reg(ptrace_registers);
#elif HAVE_BSD_REGS_T
#define ASSIGN_REG(reg) MCREG_##reg(registers.uc_mcontext) = BSDREG_##reg(ptrace_registers);
#else
#define ASSIGN_REG(reg)
	ASSERT("Don't know how to get the context of another process on this platform!");
	return bRet;
#endif
        ASSIGN_ALL_REGS
#undef ASSIGN_REG

        CONTEXTFromNativeContext(&registers, lpContext, lpContext->ContextFlags);
    }

    bRet = TRUE;
#if HAVE_BSD_REGS_T
    if (regFd != -1)
    {
        close(regFd);
    }
#endif  // HAVE_BSD_REGS_T
    return bRet;
}